

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerdisplay.cpp
# Opt level: O2

void __thiscall FListMenuItemPlayerDisplay::UpdateRandomClass(FListMenuItemPlayerDisplay *this)

{
  BYTE *pBVar1;
  FPlayerClass *pFVar2;
  int iVar3;
  int iVar4;
  FState *this_00;
  
  iVar4 = this->mRandomTimer;
  this->mRandomTimer = iVar4 + -1;
  if (0 < iVar4) {
    return;
  }
  iVar3 = this->mRandomClass + 1;
  iVar4 = 0;
  if (iVar3 < (int)PlayerClasses.Count) {
    iVar4 = iVar3;
  }
  this->mRandomClass = iVar4;
  pFVar2 = PlayerClasses.Array;
  this->mPlayerClass = PlayerClasses.Array + iVar4;
  pBVar1 = ((pFVar2[iVar4].Type)->super_PClassActor).super_PClass.Defaults;
  this_00 = *(FState **)(pBVar1 + 0x410);
  this->mPlayerState = this_00;
  if (this_00 == (FState *)0x0) {
    this_00 = *(FState **)(pBVar1 + 0x408);
    this->mPlayerState = this_00;
    if (this_00 == (FState *)0x0) {
      iVar4 = -1;
      goto LAB_0035e4ab;
    }
  }
  iVar4 = FState::GetTics(this_00);
LAB_0035e4ab:
  this->mPlayerTics = iVar4;
  this->mRandomTimer = 6;
  UpdateTranslation(this);
  return;
}

Assistant:

void FListMenuItemPlayerDisplay::UpdateRandomClass()
{
	if (--mRandomTimer < 0)
	{
		if (++mRandomClass >= (int)PlayerClasses.Size ()) mRandomClass = 0;
		mPlayerClass = &PlayerClasses[mRandomClass];
		mPlayerState = GetDefaultByType (mPlayerClass->Type)->SeeState;
		if (mPlayerState == NULL)
		{ // No see state, so try spawn state.
			mPlayerState = GetDefaultByType (mPlayerClass->Type)->SpawnState;
		}
		mPlayerTics = mPlayerState != NULL ? mPlayerState->GetTics() : -1;
		mRandomTimer = 6;

		// Since the newly displayed class may used a different translation
		// range than the old one, we need to update the translation, too.
		UpdateTranslation();
	}
}